

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::AND_ZP(CPU *this)

{
  byte bVar1;
  
  this->cycles = 3;
  bVar1 = GetByte(this);
  bVar1 = ReadByte(this,(ushort)bVar1);
  bVar1 = bVar1 & this->A;
  this->A = bVar1;
  (this->field_6).ps = bVar1 & 0x80 | (bVar1 == 0) * '\x02' | (this->field_6).ps & 0x7d;
  return;
}

Assistant:

void CPU::AND_ZP()
{
    cycles = 3;
    A &= ReadByte(GetByte());
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
}